

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gcm.c
# Opt level: O2

void gcm_mult(mbedtls_gcm_context *ctx,uchar *x,uchar *output)

{
  ulong uVar1;
  byte bVar2;
  int iVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  uchar h [16];
  
  iVar3 = mbedtls_aesni_has_support(2);
  if (iVar3 == 0) {
    uVar4 = ctx->HL[x[0xf] & 0xf];
    uVar7 = ctx->HH[x[0xf] & 0xf];
    uVar5 = 0xf;
    while( true ) {
      if ((int)uVar5 < 0) break;
      if (uVar5 != 0xf) {
        uVar6 = x[uVar5] & 0xf;
        uVar1 = uVar7 << 0x3c;
        uVar7 = last4[(uint)uVar4 & 0xf] << 0x30 ^ uVar7 >> 4 ^ ctx->HH[uVar6];
        uVar4 = (uVar4 >> 4 | uVar1) ^ ctx->HL[uVar6];
      }
      bVar2 = x[uVar5] >> 4;
      uVar1 = uVar7 << 0x3c;
      uVar7 = last4[(uint)uVar4 & 0xf] << 0x30 ^ uVar7 >> 4 ^ ctx->HH[bVar2];
      uVar4 = (uVar4 >> 4 | uVar1) ^ ctx->HL[bVar2];
      uVar5 = uVar5 - 1;
    }
    *output = (uchar)(uVar7 >> 0x38);
    output[1] = (uchar)(uVar7 >> 0x30);
    output[2] = (uchar)(uVar7 >> 0x28);
    output[3] = (uchar)(uVar7 >> 0x20);
    output[4] = (uchar)(uVar7 >> 0x18);
    output[5] = (uchar)(uVar7 >> 0x10);
    output[6] = (uchar)(uVar7 >> 8);
    output[7] = (uchar)uVar7;
    output[8] = (uchar)(uVar4 >> 0x38);
    output[9] = (uchar)(uVar4 >> 0x30);
    output[10] = (uchar)(uVar4 >> 0x28);
    output[0xb] = (uchar)(uVar4 >> 0x20);
    output[0xc] = (uchar)(uVar4 >> 0x18);
    output[0xd] = (uchar)(uVar4 >> 0x10);
    output[0xe] = (uchar)(uVar4 >> 8);
    output[0xf] = (uchar)uVar4;
  }
  else {
    uVar4 = ctx->HH[8];
    h._0_8_ = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    uVar4 = ctx->HL[8];
    h._8_8_ = uVar4 >> 0x38 | (uVar4 & 0xff000000000000) >> 0x28 | (uVar4 & 0xff0000000000) >> 0x18
              | (uVar4 & 0xff00000000) >> 8 | (uVar4 & 0xff000000) << 8 | (uVar4 & 0xff0000) << 0x18
              | (uVar4 & 0xff00) << 0x28 | uVar4 << 0x38;
    mbedtls_aesni_gcm_mult(output,x,h);
  }
  return;
}

Assistant:

static void gcm_mult( mbedtls_gcm_context *ctx, const unsigned char x[16],
                      unsigned char output[16] )
{
    int i = 0;
    unsigned char lo, hi, rem;
    uint64_t zh, zl;

#if defined(MBEDTLS_AESNI_C) && defined(MBEDTLS_HAVE_X86_64)
    if( mbedtls_aesni_has_support( MBEDTLS_AESNI_CLMUL ) ) {
        unsigned char h[16];

        PUT_UINT32_BE( ctx->HH[8] >> 32, h,  0 );
        PUT_UINT32_BE( ctx->HH[8],       h,  4 );
        PUT_UINT32_BE( ctx->HL[8] >> 32, h,  8 );
        PUT_UINT32_BE( ctx->HL[8],       h, 12 );

        mbedtls_aesni_gcm_mult( output, x, h );
        return;
    }
#endif /* MBEDTLS_AESNI_C && MBEDTLS_HAVE_X86_64 */

    lo = x[15] & 0xf;

    zh = ctx->HH[lo];
    zl = ctx->HL[lo];

    for( i = 15; i >= 0; i-- )
    {
        lo = x[i] & 0xf;
        hi = x[i] >> 4;

        if( i != 15 )
        {
            rem = (unsigned char) zl & 0xf;
            zl = ( zh << 60 ) | ( zl >> 4 );
            zh = ( zh >> 4 );
            zh ^= (uint64_t) last4[rem] << 48;
            zh ^= ctx->HH[lo];
            zl ^= ctx->HL[lo];

        }

        rem = (unsigned char) zl & 0xf;
        zl = ( zh << 60 ) | ( zl >> 4 );
        zh = ( zh >> 4 );
        zh ^= (uint64_t) last4[rem] << 48;
        zh ^= ctx->HH[hi];
        zl ^= ctx->HL[hi];
    }

    PUT_UINT32_BE( zh >> 32, output, 0 );
    PUT_UINT32_BE( zh, output, 4 );
    PUT_UINT32_BE( zl >> 32, output, 8 );
    PUT_UINT32_BE( zl, output, 12 );
}